

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O1

void yang_free_nodes(ly_ctx *ctx,lys_node *node)

{
  LYS_NODE LVar1;
  lys_node *node_00;
  lys_node *plVar2;
  char *pcVar3;
  lys_node *value;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  
  if (node != (lys_node *)0x0) {
    do {
      node_00 = node->child;
      plVar2 = node->next;
      lydict_remove(ctx,node->name);
      if ((node->nodetype & (LYS_OUTPUT|LYS_INPUT)) == LYS_UNKNOWN) {
        lys_iffeature_free(ctx,node->iffeature,node->iffeature_size,0,
                           (_func_void_lys_node_ptr_void_ptr *)0x0);
        lydict_remove(ctx,node->dsc);
        lydict_remove(ctx,node->ref);
      }
      LVar1 = node->nodetype;
      if (0xff < (int)LVar1) {
        if ((int)LVar1 < 0x800) {
          if (LVar1 == LYS_RPC) {
LAB_001584d0:
            yang_tpdf_free(ctx,*(lys_tpdf **)node->hash,0,*(uint16_t *)(node->padding + 2));
            free(*(void **)node->hash);
          }
          else if ((LVar1 == LYS_INPUT) || (LVar1 == LYS_OUTPUT)) {
            yang_tpdf_free(ctx,*(lys_tpdf **)node->hash,0,*(uint16_t *)(node->padding + 2));
            free(*(void **)node->hash);
            if (node->padding[1] != '\0') {
              lVar7 = 0;
              uVar4 = 0;
              do {
                lys_restr_free(ctx,(lys_restr *)(node[1].name + lVar7),
                               (_func_void_lys_node_ptr_void_ptr *)0x0);
                uVar4 = uVar4 + 1;
                lVar7 = lVar7 + 0x38;
              } while (uVar4 < node->padding[1]);
            }
            pcVar3 = node[1].name;
            goto LAB_0015879b;
          }
        }
        else if ((int)LVar1 < 0x4000) {
          if (LVar1 == LYS_GROUPING) goto LAB_001584d0;
          if (LVar1 == LYS_USES) {
            if (node->padding[2] != '\0') {
              uVar4 = 0;
              do {
                lVar7 = uVar4 * 0x50;
                lydict_remove(ctx,*(char **)(node[1].name + lVar7));
                lydict_remove(ctx,*(char **)(node[1].name + lVar7 + 8));
                lydict_remove(ctx,*(char **)(node[1].name + lVar7 + 0x10));
                pcVar3 = node[1].name;
                if (pcVar3[lVar7 + 0x1e] != '\0') {
                  lVar6 = 0;
                  uVar5 = 0;
                  do {
                    lys_restr_free(ctx,(lys_restr *)(*(long *)(pcVar3 + lVar7 + 0x38) + lVar6),
                                   (_func_void_lys_node_ptr_void_ptr *)0x0);
                    uVar5 = uVar5 + 1;
                    pcVar3 = node[1].name;
                    lVar6 = lVar6 + 0x38;
                  } while (uVar5 < (byte)pcVar3[lVar7 + 0x1e]);
                }
                free(*(void **)(pcVar3 + lVar7 + 0x38));
                pcVar3 = node[1].name;
                if (pcVar3[lVar7 + 0x1f] != '\0') {
                  uVar5 = 0;
                  do {
                    lydict_remove(ctx,*(char **)(*(long *)(pcVar3 + lVar7 + 0x40) + uVar5 * 8));
                    uVar5 = uVar5 + 1;
                    pcVar3 = node[1].name;
                  } while (uVar5 < (byte)pcVar3[lVar7 + 0x1f]);
                }
                free(*(void **)(pcVar3 + lVar7 + 0x40));
                if ((node[1].name[lVar7 + 0x1c] & 1U) != 0) {
                  lydict_remove(ctx,*(char **)(node[1].name + lVar7 + 0x48));
                }
                lys_extension_instances_free
                          (ctx,*(lys_ext_instance ***)(node[1].name + uVar4 * 0x50 + 0x20),
                           (uint)(byte)node[1].name[uVar4 * 0x50 + 0x1a],
                           (_func_void_lys_node_ptr_void_ptr *)0x0);
                uVar4 = uVar4 + 1;
              } while (uVar4 < node->padding[2]);
            }
            free(node[1].name);
            lys_when_free(ctx,*(lys_when **)node->hash,(_func_void_lys_node_ptr_void_ptr *)0x0);
          }
        }
        else {
          if (LVar1 == LYS_ANYDATA) {
LAB_00158560:
            if (node->padding[3] != '\0') {
              lVar7 = 0;
              uVar4 = 0;
              do {
                lys_restr_free(ctx,(lys_restr *)(node[1].dsc + lVar7),
                               (_func_void_lys_node_ptr_void_ptr *)0x0);
                uVar4 = uVar4 + 1;
                lVar7 = lVar7 + 0x38;
              } while (uVar4 < node->padding[3]);
            }
            goto LAB_00158596;
          }
          if (LVar1 == LYS_ACTION) goto LAB_001584d0;
        }
        goto switchD_0015823d_caseD_3;
      }
      if (0xf < (int)LVar1) {
        if ((int)LVar1 < 0x40) {
          if (LVar1 == LYS_LIST) {
            yang_tpdf_free(ctx,(lys_tpdf *)node[1].ref,0,(ushort)node->padding[1]);
            free(node[1].ref);
            if (node->padding[0] != '\0') {
              lVar7 = 0;
              uVar4 = 0;
              do {
                lys_restr_free(ctx,(lys_restr *)(node[1].dsc + lVar7),
                               (_func_void_lys_node_ptr_void_ptr *)0x0);
                uVar4 = uVar4 + 1;
                lVar7 = lVar7 + 0x38;
              } while (uVar4 < node->padding[0]);
            }
            free(node[1].dsc);
            lys_when_free(ctx,(lys_when *)node[1].name,(_func_void_lys_node_ptr_void_ptr *)0x0);
            if (node->padding[3] != '\0') {
              lVar7 = 0;
              uVar4 = 0;
              do {
                free(*(void **)((long)node[1].ext + lVar7));
                uVar4 = uVar4 + 1;
                lVar7 = lVar7 + 0x10;
              } while (uVar4 < node->padding[3]);
            }
            free(node[1].ext);
            pcVar3 = *(char **)&node[1].flags;
LAB_0015879b:
            free(pcVar3);
          }
          else if (LVar1 == LYS_ANYXML) goto LAB_00158560;
        }
        else {
          if (LVar1 == LYS_CASE) goto LAB_00158659;
          if (LVar1 == LYS_NOTIF) {
            yang_tpdf_free(ctx,(lys_tpdf *)node[1].name,0,*(uint16_t *)(node->padding + 2));
            free(node[1].name);
            if (node->padding[1] != '\0') {
              lVar7 = 0;
              uVar4 = 0;
              do {
                lys_restr_free(ctx,(lys_restr *)(node[1].dsc + lVar7),
                               (_func_void_lys_node_ptr_void_ptr *)0x0);
                uVar4 = uVar4 + 1;
                lVar7 = lVar7 + 0x38;
              } while (uVar4 < node->padding[1]);
            }
            pcVar3 = node[1].dsc;
            goto LAB_0015879b;
          }
        }
        goto switchD_0015823d_caseD_3;
      }
      switch(LVar1) {
      case LYS_CONTAINER:
        yang_tpdf_free(ctx,(lys_tpdf *)node[1].ref,0,*(uint16_t *)(node->padding + 2));
        free(node[1].ref);
        lydict_remove(ctx,*(char **)&node[1].flags);
        if (node->padding[1] != '\0') {
          lVar7 = 0;
          uVar4 = 0;
          do {
            lys_restr_free(ctx,(lys_restr *)(node[1].dsc + lVar7),
                           (_func_void_lys_node_ptr_void_ptr *)0x0);
            uVar4 = uVar4 + 1;
            lVar7 = lVar7 + 0x38;
          } while (uVar4 < node->padding[1]);
        }
LAB_00158596:
        free(node[1].dsc);
        lys_when_free(ctx,(lys_when *)node[1].name,(_func_void_lys_node_ptr_void_ptr *)0x0);
        break;
      case LYS_CHOICE:
        free(node[1].name);
LAB_00158659:
        lys_when_free(ctx,*(lys_when **)node->hash,(_func_void_lys_node_ptr_void_ptr *)0x0);
        break;
      case LYS_LEAF:
        if (node->padding[3] != '\0') {
          lVar7 = 0;
          uVar4 = 0;
          do {
            lys_restr_free(ctx,(lys_restr *)(node[1].dsc + lVar7),
                           (_func_void_lys_node_ptr_void_ptr *)0x0);
            uVar4 = uVar4 + 1;
            lVar7 = lVar7 + 0x38;
          } while (uVar4 < node->padding[3]);
        }
        free(node[1].dsc);
        lys_when_free(ctx,(lys_when *)node[1].name,(_func_void_lys_node_ptr_void_ptr *)0x0);
        yang_type_free(ctx,(lys_type *)&node[1].ref);
        lydict_remove(ctx,(char *)node[1].next);
        value = node[1].prev;
        goto LAB_001586de;
      case LYS_LEAFLIST:
        if (node->padding[3] != '\0') {
          lVar7 = 0;
          uVar4 = 0;
          do {
            lys_restr_free(ctx,(lys_restr *)(node[1].dsc + lVar7),
                           (_func_void_lys_node_ptr_void_ptr *)0x0);
            uVar4 = uVar4 + 1;
            lVar7 = lVar7 + 0x38;
          } while (uVar4 < node->padding[3]);
        }
        free(node[1].dsc);
        if (node->padding[2] != '\0') {
          uVar4 = 0;
          do {
            lydict_remove(ctx,*(char **)((node[1].prev)->padding + uVar4 * 8 + -0x1c));
            uVar4 = uVar4 + 1;
          } while (uVar4 < node->padding[2]);
        }
        free(node[1].prev);
        lys_when_free(ctx,(lys_when *)node[1].name,(_func_void_lys_node_ptr_void_ptr *)0x0);
        yang_type_free(ctx,(lys_type *)&node[1].ref);
        value = node[1].next;
LAB_001586de:
        lydict_remove(ctx,(char *)value);
      }
switchD_0015823d_caseD_3:
      lys_extension_instances_free
                (ctx,node->ext,(uint)node->ext_size,(_func_void_lys_node_ptr_void_ptr *)0x0);
      yang_free_nodes(ctx,node_00);
      free(node);
      node = plVar2;
    } while (plVar2 != (lys_node *)0x0);
  }
  return;
}

Assistant:

static void
yang_free_nodes(struct ly_ctx *ctx, struct lys_node *node)
{
    struct lys_node *tmp, *child, *sibling;

    if (!node) {
        return;
    }
    tmp = node;

    while (tmp) {
        child = tmp->child;
        sibling = tmp->next;
        /* common part */
        lydict_remove(ctx, tmp->name);
        if (!(tmp->nodetype & (LYS_INPUT | LYS_OUTPUT))) {
            lys_iffeature_free(ctx, tmp->iffeature, tmp->iffeature_size, 0, NULL);
            lydict_remove(ctx, tmp->dsc);
            lydict_remove(ctx, tmp->ref);
        }

        switch (tmp->nodetype) {
        case LYS_GROUPING:
        case LYS_RPC:
        case LYS_ACTION:
            yang_free_grouping(ctx, (struct lys_node_grp *)tmp);
            break;
        case LYS_CONTAINER:
            yang_free_container(ctx, (struct lys_node_container *)tmp);
            break;
        case LYS_LEAF:
            yang_free_leaf(ctx, (struct lys_node_leaf *)tmp);
            break;
        case LYS_LEAFLIST:
            yang_free_leaflist(ctx, (struct lys_node_leaflist *)tmp);
            break;
        case LYS_LIST:
            yang_free_list(ctx, (struct lys_node_list *)tmp);
            break;
        case LYS_CHOICE:
            yang_free_choice(ctx, (struct lys_node_choice *)tmp);
            break;
        case LYS_CASE:
            lys_when_free(ctx, ((struct lys_node_case *)tmp)->when, NULL);
            break;
        case LYS_ANYXML:
        case LYS_ANYDATA:
            yang_free_anydata(ctx, (struct lys_node_anydata *)tmp);
            break;
        case LYS_INPUT:
        case LYS_OUTPUT:
            yang_free_inout(ctx, (struct lys_node_inout *)tmp);
            break;
        case LYS_NOTIF:
            yang_free_notif(ctx, (struct lys_node_notif *)tmp);
            break;
        case LYS_USES:
            yang_free_uses(ctx, (struct lys_node_uses *)tmp);
            break;
        default:
            break;
        }
        lys_extension_instances_free(ctx, tmp->ext, tmp->ext_size, NULL);
        yang_free_nodes(ctx, child);
        free(tmp);
        tmp = sibling;
    }
}